

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeSIMDReplace<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDReplaceOp op,size_t lanes)

{
  optional<unsigned_char> oVar1;
  string local_78;
  Err local_58;
  SIMDReplaceOp local_38;
  allocator<char> local_31;
  
  local_38 = op;
  oVar1 = Lexer::takeU<unsigned_char>(&ctx->in);
  if (((ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"expected lane index",&local_31);
    Lexer::err(&local_58,&ctx->in,&local_78);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    ParseDefsCtx::makeSIMDReplace
              (__return_storage_ptr__,ctx,pos,annotations,local_38,
               oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_char>._M_payload);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDReplace(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations,
                         SIMDReplaceOp op,
                         size_t lanes) {
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return ctx.in.err("expected lane index");
  }
  return ctx.makeSIMDReplace(pos, annotations, op, *lane);
}